

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(SessionHandle *data,connectdata **in_connect,_Bool *asyncp,
                     _Bool *protocol_done)

{
  undefined1 auVar1 [16];
  curl_proxytype cVar2;
  uint uVar3;
  char cVar4;
  CURLcode CVar5;
  int iVar6;
  CURLcode CVar7;
  SessionHandle *pSVar8;
  void *pvVar9;
  connectdata *pcVar10;
  char *pcVar11;
  curl_llist *pcVar12;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  size_t sVar16;
  size_t __n;
  size_t sVar17;
  byte *__dest;
  long lVar18;
  ulong uVar19;
  connectdata *pcVar20;
  hostname *host;
  Curl_handler *pCVar21;
  conncache *connc;
  Curl_handler **ppCVar22;
  undefined4 uVar23;
  bool bVar24;
  _Bool _Var25;
  undefined1 auVar26 [16];
  timeval tVar27;
  _Bool waitpipe;
  _Bool force_reuse;
  char *passwd;
  char *user;
  char *options;
  char *userp;
  char *passwdp;
  connectdata *conn_temp;
  char protobuf [16];
  _Bool local_ba;
  _Bool local_b9;
  connectdata **local_b8;
  char *local_b0;
  char *local_a8;
  undefined4 local_9c;
  char *local_98;
  char *local_90;
  char *local_88;
  SessionHandle *local_80;
  char *local_78;
  void *local_70;
  char *local_68;
  char *local_60;
  _Bool *local_58;
  connectdata *local_50;
  undefined1 local_48 [16];
  char *local_38;
  
  *asyncp = false;
  local_50 = (connectdata *)0x0;
  local_90 = (char *)0x0;
  local_98 = (char *)0x0;
  local_88 = (char *)0x0;
  local_b9 = false;
  local_ba = false;
  pSVar8 = (SessionHandle *)Curl_multi_max_host_connections(data->multi);
  pvVar9 = (void *)Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  local_58 = asyncp;
  if ((data->change).url == (char *)0x0) {
    CVar5 = CURLE_URL_MALFORMAT;
    goto LAB_0011a381;
  }
  local_80 = pSVar8;
  local_70 = pvVar9;
  pcVar10 = (connectdata *)(*Curl_ccalloc)(1,0x5a0);
  CVar7 = CURLE_OUT_OF_MEMORY;
  CVar5 = CVar7;
  if (pcVar10 == (connectdata *)0x0) goto LAB_0011a381;
  pcVar10->handler = &Curl_handler_dummy;
  pcVar10->connection_id = -1;
  pcVar10->port = -1;
  pcVar10->remote_port = -1;
  pcVar10->sock[0] = -1;
  pcVar10->sock[1] = -1;
  pcVar10->tempsock[0] = -1;
  pcVar10->tempsock[1] = -1;
  (pcVar10->bits).close = true;
  tVar27 = curlx_tvnow();
  pcVar10->created = tVar27;
  pcVar10->data = data;
  cVar2 = (data->set).proxytype;
  pcVar10->proxytype = cVar2;
  pcVar11 = (data->set).str[0xf];
  if (pcVar11 == (char *)0x0) {
    (pcVar10->bits).proxy = false;
LAB_0011a23d:
    _Var25 = false;
  }
  else {
    bVar24 = *pcVar11 == '\0';
    (pcVar10->bits).proxy = !bVar24;
    if (bVar24) goto LAB_0011a23d;
    if (cVar2 == CURLPROXY_HTTP) {
      _Var25 = true;
    }
    else {
      _Var25 = cVar2 == CURLPROXY_HTTP_1_0;
    }
  }
  (pcVar10->bits).httpproxy = _Var25;
  (pcVar10->bits).proxy_user_passwd = (data->set).str[0x1f] != (char *)0x0;
  (pcVar10->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (pcVar10->bits).user_passwd = (data->set).str[0x1c] != (char *)0x0;
  (pcVar10->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (pcVar10->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  pcVar10->verifypeer = (data->set).ssl.verifypeer;
  pcVar10->verifyhost = (data->set).ssl.verifyhost;
  pcVar10->ip_version = (data->set).ipver;
  _Var25 = Curl_pipeline_wanted(data->multi,1);
  if ((_Var25) && (pcVar10->master_buffer == (char *)0x0)) {
    pcVar11 = (char *)(*Curl_ccalloc)(0x4000,1);
    pcVar10->master_buffer = pcVar11;
    if (pcVar11 != (char *)0x0) goto LAB_0011a2f7;
  }
  else {
LAB_0011a2f7:
    pcVar12 = Curl_llist_alloc(llist_dtor);
    pcVar10->send_pipe = pcVar12;
    pcVar12 = Curl_llist_alloc(llist_dtor);
    pcVar10->recv_pipe = pcVar12;
    if (pcVar12 != (curl_llist *)0x0 && pcVar10->send_pipe != (curl_llist *)0x0) {
      pcVar11 = (data->set).str[5];
      if (pcVar11 != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pcVar11);
        pcVar10->localdev = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_0011a335;
      }
      pcVar10->localportrange = (data->set).localportrange;
      pcVar10->localport = (data->set).localport;
      pvVar9 = (data->set).closesocket_client;
      pcVar10->fclosesocket = (data->set).fclosesocket;
      pcVar10->closesocket_client = pvVar9;
      *in_connect = pcVar10;
      sVar13 = strlen((data->change).url);
      sVar16 = 0x100;
      if (0x100 < sVar13) {
        sVar16 = sVar13;
      }
      (*Curl_cfree)((data->state).pathbuffer);
      (data->state).pathbuffer = (char *)0x0;
      (data->state).path = (char *)0x0;
      pcVar11 = (char *)(*Curl_cmalloc)(sVar16 + 2);
      (data->state).pathbuffer = pcVar11;
      if (pcVar11 == (char *)0x0) goto LAB_0011a381;
      (data->state).path = pcVar11;
      pcVar11 = (char *)(*Curl_cmalloc)(sVar16 + 2);
      (pcVar10->host).rawalloc = pcVar11;
      if (pcVar11 == (char *)0x0) {
        (*Curl_cfree)((data->state).pathbuffer);
        (data->state).pathbuffer = (char *)0x0;
        (data->state).path = (char *)0x0;
        goto LAB_0011a381;
      }
      (pcVar10->host).name = pcVar11;
      *pcVar11 = '\0';
      local_b8 = in_connect;
      pcVar11 = (*Curl_cstrdup)("");
      local_90 = pcVar11;
      pcVar14 = (*Curl_cstrdup)("");
      local_98 = pcVar14;
      local_88 = (*Curl_cstrdup)("");
      in_connect = local_b8;
      if (local_88 == (char *)0x0 || (pcVar14 == (char *)0x0 || pcVar11 == (char *)0x0))
      goto LAB_0011a381;
      pcVar11 = (data->state).path;
      local_48 = (undefined1  [16])0x0;
      pcVar14 = (data->change).url;
      local_38 = local_88;
      pcVar15 = strpbrk(pcVar14,"\r\n");
      if (pcVar15 != (char *)0x0) {
        Curl_failf(data,"Illegal characters found in URL");
        in_connect = local_b8;
        CVar5 = CURLE_URL_MALFORMAT;
        goto LAB_0011a381;
      }
      local_a8 = local_48;
      iVar6 = __isoc99_sscanf(pcVar14,"%15[^:]:%[^\n]",local_a8,pcVar11);
      local_b0 = pcVar11;
      if ((iVar6 == 2) && (iVar6 = Curl_raw_equal(local_48,"file"), iVar6 != 0)) {
        if (*pcVar11 == '/') {
          if (pcVar11[1] == '/') {
            pcVar14 = local_b0 + 2;
            sVar16 = strlen(pcVar14);
            pcVar11 = local_b0;
            memmove(local_b0,pcVar14,sVar16 + 1);
            if (*pcVar11 != '/') goto LAB_0011a67a;
          }
        }
        else {
LAB_0011a67a:
          pcVar11 = strchr(pcVar11,0x2f);
          if (pcVar11 != (char *)0x0) {
            pcVar14 = pcVar11 + 1;
            if (pcVar11[1] != '/') {
              pcVar14 = pcVar11;
            }
            sVar16 = strlen(pcVar14);
            memmove(local_b0,pcVar14,sVar16 + 1);
          }
        }
        uVar23 = 0;
        local_a8 = "file";
      }
      else {
        *pcVar11 = '\0';
        uVar23 = 0;
        iVar6 = __isoc99_sscanf((data->change).url,"%15[^\n:]://%[^\n/?]%[^\n]",local_48,
                                (pcVar10->host).name,pcVar11);
        if (iVar6 < 2) {
          iVar6 = __isoc99_sscanf((data->change).url,"%[^\n/?]%[^\n]",(pcVar10->host).name,pcVar11);
          if (iVar6 < 1) {
            Curl_failf(data,"<url> malformed");
            in_connect = local_b8;
            CVar5 = CURLE_URL_MALFORMAT;
            goto LAB_0011a381;
          }
          iVar6 = Curl_raw_nequal("FTP.",(pcVar10->host).name,4);
          uVar23 = 1;
          if (iVar6 == 0) {
            iVar6 = Curl_raw_nequal("DICT.",(pcVar10->host).name,5);
            if (iVar6 == 0) {
              iVar6 = Curl_raw_nequal("LDAP.",(pcVar10->host).name,5);
              if (iVar6 == 0) {
                iVar6 = Curl_raw_nequal("IMAP.",(pcVar10->host).name,5);
                if (iVar6 == 0) {
                  iVar6 = Curl_raw_nequal("SMTP.",(pcVar10->host).name,5);
                  if (iVar6 == 0) {
                    iVar6 = Curl_raw_nequal("POP3.",(pcVar10->host).name,5);
                    local_a8 = "pop3";
                    if (iVar6 == 0) {
                      local_a8 = "http";
                    }
                  }
                  else {
                    local_a8 = "smtp";
                  }
                  uVar23 = 1;
                }
                else {
                  local_a8 = "IMAP";
                }
              }
              else {
                local_a8 = "LDAP";
              }
            }
            else {
              local_a8 = "DICT";
            }
          }
          else {
            local_a8 = "ftp";
          }
        }
      }
      pcVar11 = (pcVar10->host).name;
      pcVar15 = strchr(pcVar11,0x40);
      pcVar14 = pcVar15 + 1;
      if (pcVar15 == (char *)0x0) {
        pcVar14 = pcVar11;
      }
      pcVar11 = strchr(pcVar14,0x3f);
      bVar24 = pcVar11 != (char *)0x0;
      local_9c = uVar23;
      if (pcVar11 == (char *)0x0) {
        cVar4 = *local_b0;
        if (cVar4 != '\0') goto LAB_0011a87b;
        local_b0[0] = '/';
        local_b0[1] = '\0';
        bVar24 = true;
LAB_0011a8b4:
        pcVar11 = local_b0;
        if ((data->set).path_as_is == false) {
          pcVar14 = Curl_dedotdotify(local_b0);
          if (pcVar14 != (char *)0x0) {
            iVar6 = strcmp(pcVar14,pcVar11);
            if (iVar6 != 0) {
              (*Curl_cfree)((data->state).pathbuffer);
              (data->state).pathbuffer = pcVar14;
              (data->state).path = pcVar14;
              uVar23 = local_9c;
              local_b0 = pcVar14;
              goto LAB_0011a91e;
            }
            (*Curl_cfree)(pcVar14);
            goto LAB_0011a8bf;
          }
          goto LAB_0011aa46;
        }
LAB_0011a8bf:
        uVar23 = local_9c;
        if (bVar24) goto LAB_0011a91e;
      }
      else {
        sVar16 = strlen(pcVar11);
        pcVar14 = local_b0;
        sVar13 = strlen(local_b0);
        memmove(pcVar14 + sVar16 + 1,pcVar14,sVar13 + 1);
        memcpy(pcVar14 + 1,pcVar11,sVar16);
        *pcVar14 = '/';
        *pcVar11 = '\0';
        cVar4 = *pcVar14;
LAB_0011a87b:
        uVar23 = local_9c;
        pcVar11 = local_b0;
        if (cVar4 != '?') goto LAB_0011a8b4;
        pcVar14 = local_b0 + 1;
        sVar16 = strlen(local_b0);
        memmove(pcVar14,pcVar11,sVar16 + 1);
        *pcVar11 = '/';
LAB_0011a91e:
        sVar16 = strlen(local_b0);
        sVar13 = strlen((data->change).url);
        __n = strlen((pcVar10->host).name);
        if ((char)uVar23 == '\0') {
          sVar17 = strlen(local_a8);
          __n = __n + sVar17 + 3;
        }
        pcVar11 = (char *)(*Curl_cmalloc)(sVar13 + 2);
        if (pcVar11 == (char *)0x0) {
LAB_0011aa46:
          in_connect = local_b8;
          CVar5 = CURLE_OUT_OF_MEMORY;
          goto LAB_0011a381;
        }
        memcpy(pcVar11,(data->change).url,__n);
        memcpy(pcVar11 + __n,local_b0,sVar16 + 1);
        if ((data->change).url_alloc == true) {
          (*Curl_cfree)((data->change).url);
          (data->change).url = (char *)0x0;
          (data->change).url_alloc = false;
        }
        Curl_infof(data,"Rebuilt URL to: %s\n",pcVar11);
        (data->change).url = pcVar11;
        (data->change).url_alloc = true;
      }
      local_78 = (char *)0x0;
      local_60 = (char *)0x0;
      CVar5 = CURLE_OK;
      local_68 = (char *)0x0;
      pcVar11 = (pcVar10->host).name;
      pcVar14 = strchr(pcVar11,0x40);
      if (pcVar14 != (char *)0x0) {
        (pcVar10->host).name = pcVar14 + 1;
        if (((data->set).use_netrc != CURL_NETRC_REQUIRED) &&
           (CVar5 = parse_login_details(pcVar11,(size_t)(pcVar14 + 1 + ~(ulong)pcVar11),&local_78,
                                        &local_60,&local_68), CVar5 == CURLE_OK)) {
          if (local_78 == (char *)0x0) {
LAB_0011ab3c:
            if (local_60 != (char *)0x0) {
              pcVar11 = curl_easy_unescape(data,local_60,0,(int *)0x0);
              if (pcVar11 == (char *)0x0) goto LAB_0011abdb;
              (*Curl_cfree)(local_98);
              local_98 = pcVar11;
            }
            CVar5 = CURLE_OK;
            if (local_68 != (char *)0x0) {
              pcVar11 = curl_easy_unescape(data,local_68,0,(int *)0x0);
              if (pcVar11 == (char *)0x0) goto LAB_0011abdb;
              (*Curl_cfree)(local_38);
              local_88 = pcVar11;
            }
          }
          else {
            (pcVar10->bits).userpwd_in_url = true;
            (pcVar10->bits).user_passwd = true;
            pcVar11 = curl_easy_unescape(data,local_78,0,(int *)0x0);
            if (pcVar11 != (char *)0x0) {
              (*Curl_cfree)(local_90);
              local_90 = pcVar11;
              goto LAB_0011ab3c;
            }
LAB_0011abdb:
            CVar5 = CURLE_OUT_OF_MEMORY;
          }
        }
      }
      (*Curl_cfree)(local_78);
      (*Curl_cfree)(local_60);
      (*Curl_cfree)(local_68);
      uVar23 = local_9c;
      pcVar11 = local_b0;
      in_connect = local_b8;
      if (CVar5 == CURLE_OK) {
        pcVar14 = (pcVar10->host).name;
        if ((*pcVar14 == '[') && (__dest = (byte *)strchr(pcVar14,0x25), __dest != (byte *)0x0)) {
          iVar6 = *__dest - 0x25;
          if ((iVar6 == 0) && (iVar6 = __dest[1] - 0x32, iVar6 == 0)) {
            iVar6 = 0x35 - (uint)__dest[2];
          }
          else {
            iVar6 = -iVar6;
          }
          if (iVar6 == 0) {
            lVar18 = 3;
          }
          else {
            Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
            lVar18 = 1;
          }
          uVar19 = strtoul((char *)(__dest + lVar18),&local_78,10);
          pcVar11 = local_78;
          if (*local_78 == ']') {
            sVar16 = strlen(local_78);
            memmove(__dest,pcVar11,sVar16 + 1);
            pcVar10->scope_id = (uint)uVar19;
            pcVar11 = local_b0;
            uVar23 = local_9c;
          }
          else {
            Curl_infof(data,"Invalid IPv6 address format\n");
            pcVar11 = local_b0;
            uVar23 = local_9c;
          }
        }
        uVar3 = (data->set).scope_id;
        if (uVar3 != 0) {
          pcVar10->scope_id = uVar3;
        }
        pcVar11 = strchr(pcVar11,0x23);
        if (pcVar11 != (char *)0x0) {
          *pcVar11 = '\0';
          pcVar11 = strchr((data->change).url,0x23);
          if (pcVar11 != (char *)0x0) {
            *pcVar11 = '\0';
          }
        }
        pCVar21 = &Curl_handler_http;
        ppCVar22 = protocols;
        do {
          ppCVar22 = ppCVar22 + 1;
          iVar6 = Curl_raw_equal(pCVar21->scheme,local_a8);
          if (iVar6 != 0) {
            if ((((uint)(data->set).allowed_protocols & pCVar21->protocol) != 0) &&
               (((data->state).this_is_a_follow != true ||
                (((uint)(data->set).redir_protocols & pCVar21->protocol) != 0)))) {
              pcVar10->given = pCVar21;
              pcVar10->handler = pCVar21;
              if ((char)uVar23 != '\0') {
                pcVar11 = curl_maprintf("%s://%s",pCVar21->scheme,(data->change).url);
                in_connect = local_b8;
                CVar5 = CVar7;
                if (pcVar11 == (char *)0x0) goto LAB_0011a381;
                if ((data->change).url_alloc == true) {
                  (*Curl_cfree)((data->change).url);
                }
                (data->change).url = pcVar11;
                (data->change).url_alloc = true;
                pCVar21 = pcVar10->given;
              }
              if (((pCVar21->flags & 0x40) != 0) &&
                 (pcVar11 = strchr((pcVar10->data->state).path,0x3f), pcVar11 != (char *)0x0)) {
                *pcVar11 = '\0';
              }
              pcVar11 = (data->set).str[0x27];
              if (pcVar11 != (char *)0x0) {
                pcVar11 = (*Curl_cstrdup)(pcVar11);
                pcVar10->xoauth2_bearer = pcVar11;
                in_connect = local_b8;
                CVar5 = CVar7;
                if (pcVar11 == (char *)0x0) goto LAB_0011a381;
              }
              if (((pcVar10->bits).proxy_user_passwd == true) &&
                 (CVar5 = parse_proxy_auth(data,pcVar10), in_connect = local_b8, CVar5 != CURLE_OK))
              goto LAB_0011a381;
              pcVar11 = (data->set).str[0xf];
              if (pcVar11 == (char *)0x0) {
                pcVar11 = (char *)0x0;
              }
              else {
                pcVar11 = (*Curl_cstrdup)(pcVar11);
                if (pcVar11 == (char *)0x0) {
                  Curl_failf(data,"memory shortage");
                  in_connect = local_b8;
                  CVar5 = CVar7;
                  goto LAB_0011a381;
                }
              }
              pcVar14 = (data->set).str[0x21];
              if ((pcVar14 == (char *)0x0) ||
                 (_Var25 = check_noproxy((pcVar10->host).name,pcVar14), !_Var25)) {
                if ((pcVar11 == (char *)0x0) &&
                   (pcVar11 = detect_proxy(pcVar10), pcVar11 == (char *)0x0)) goto LAB_0011ae88;
                if ((*pcVar11 == '\0') || ((pcVar10->handler->flags & 0x10) != 0))
                goto LAB_0011ae83;
                CVar5 = parse_proxy(data,pcVar10,pcVar11);
                (*Curl_cfree)(pcVar11);
                in_connect = local_b8;
                if (CVar5 != CURLE_OK) goto LAB_0011a381;
                if (pcVar10->proxytype < 2) {
                  if (((pcVar10->handler->protocol & 3) == 0) &&
                     ((pcVar10->bits).tunnel_proxy == false)) {
                    pcVar10->handler = &Curl_handler_http;
                  }
                  (pcVar10->bits).proxy = true;
                  (pcVar10->bits).httpproxy = true;
                  _Var25 = true;
                  if ((pcVar10->given->flags & 1) == 0) goto LAB_0011aea3;
                  goto LAB_0011ae9c;
                }
                (pcVar10->bits).tunnel_proxy = false;
                (pcVar10->bits).proxy = true;
                (pcVar10->bits).httpproxy = false;
              }
              else {
LAB_0011ae83:
                (*Curl_cfree)(pcVar11);
LAB_0011ae88:
                (pcVar10->bits).proxy = false;
                (pcVar10->bits).httpproxy = false;
                (pcVar10->bits).proxy_user_passwd = false;
                _Var25 = false;
LAB_0011ae9c:
                (pcVar10->bits).tunnel_proxy = _Var25;
              }
LAB_0011aea3:
              CVar5 = parse_remote_port(data,pcVar10);
              in_connect = local_b8;
              if ((((CVar5 != CURLE_OK) ||
                   (CVar5 = override_login(data,pcVar10,&local_90,&local_98,&local_88),
                   in_connect = local_b8, CVar5 != CURLE_OK)) ||
                  (CVar5 = set_login(pcVar10,local_90,local_98,local_88), in_connect = local_b8,
                  CVar5 != CURLE_OK)) ||
                 (CVar5 = setup_connection_internals(pcVar10), in_connect = local_b8,
                 CVar5 != CURLE_OK)) goto LAB_0011a381;
              pcVar10->recv[0] = Curl_recv_plain;
              pcVar10->send[0] = Curl_send_plain;
              pcVar10->recv[1] = Curl_recv_plain;
              pcVar10->send[1] = Curl_send_plain;
              if ((pcVar10->handler->flags & 0x10) != 0) {
                CVar7 = (*pcVar10->handler->connect_it)(pcVar10,(_Bool *)local_48);
                if (CVar7 == CURLE_OK) {
                  pcVar10->data = data;
                  (pcVar10->bits).tcpconnect[0] = true;
                  Curl_conncache_add_conn((data->state).conn_cache,pcVar10);
                  CVar5 = setup_range(data);
                  if (CVar5 != CURLE_OK) {
                    (*pcVar10->handler->done)(pcVar10,CVar5,false);
                    in_connect = local_b8;
                    goto LAB_0011a381;
                  }
                  Curl_setup_transfer(pcVar10,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
                }
                Curl_init_do(data,pcVar10);
                in_connect = local_b8;
                CVar5 = CVar7;
                goto LAB_0011a381;
              }
              pcVar11 = (data->set).str[0x14];
              (data->set).ssl.CApath = (data->set).str[0x13];
              (data->set).ssl.CAfile = pcVar11;
              pcVar11 = (data->set).str[0x1b];
              (data->set).ssl.CRLfile = (data->set).str[0x1a];
              (data->set).ssl.issuercert = pcVar11;
              auVar1 = *(undefined1 (*) [16])((data->set).str + 0x17);
              auVar26._0_8_ = auVar1._8_8_;
              auVar26._8_4_ = auVar1._0_4_;
              auVar26._12_4_ = auVar1._4_4_;
              (data->set).ssl.random_file = (char *)auVar26._0_8_;
              (data->set).ssl.egdsocket = (char *)auVar26._8_8_;
              (data->set).ssl.cipher_list = (data->set).str[0x16];
              _Var25 = Curl_clone_ssl_config(&(data->set).ssl,&pcVar10->ssl_config);
              in_connect = local_b8;
              CVar5 = CVar7;
              if (!_Var25) goto LAB_0011a381;
              prune_dead_connections(data);
              if ((((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)) ||
                 (_Var25 = ConnectionExists(data,pcVar10,&local_50,&local_b9,&local_ba),
                 pcVar20 = local_50, !_Var25)) {
LAB_0011b166:
                if (local_ba != false) {
LAB_0011b171:
                  Curl_infof(data,"No connections available.\n");
                  conn_free(pcVar10);
                  *local_b8 = (connectdata *)0x0;
                  in_connect = local_b8;
                  CVar5 = CURLE_NO_CONNECTION_AVAILABLE;
                  goto LAB_0011a381;
                }
                connc = (data->state).conn_cache;
                pSVar8 = (SessionHandle *)Curl_conncache_find_bundle(pcVar10,connc);
                if ((pSVar8 != (SessionHandle *)0x0 && local_80 != (SessionHandle *)0x0) &&
                   (local_80 <= pSVar8->prev)) {
                  pcVar20 = find_oldest_idle_connection_in_bundle(pSVar8,(connectbundle *)connc);
                  if (pcVar20 == (connectdata *)0x0) {
                    Curl_infof(data,"No more connections allowed to host: %d\n",local_80);
                    goto LAB_0011b171;
                  }
                  pcVar20->data = data;
                  Curl_disconnect(pcVar20,false);
                }
                pSVar8 = (SessionHandle *)(data->state).conn_cache;
                if ((local_70 != (void *)0x0) && (local_70 <= (pSVar8->msg).extmsg.data.whatever)) {
                  pcVar20 = find_oldest_idle_connection(pSVar8);
                  if (pcVar20 == (connectdata *)0x0) {
                    Curl_infof(data,"No connections available in cache\n");
                    goto LAB_0011b171;
                  }
                  pcVar20->data = data;
                  Curl_disconnect(pcVar20,false);
                  pSVar8 = (SessionHandle *)(data->state).conn_cache;
                }
                Curl_conncache_add_conn((conncache *)pSVar8,pcVar10);
                pcVar20 = pcVar10;
              }
              else {
                if (((local_b9 == false) &&
                    (_Var25 = IsPipeliningPossible
                                        (data,(connectdata *)(ulong)local_50->handler->protocol),
                    _Var25)) &&
                   ((pcVar20->recv_pipe->size + pcVar20->send_pipe->size != 0 &&
                    ((Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
                                 pcVar20->connection_id),
                     (SessionHandle *)pcVar20->bundle->num_connections < local_80 &&
                     ((void *)((data->state).conn_cache)->num_connections < local_70)))))) {
                  Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
                  goto LAB_0011b166;
                }
                pcVar20->inuse = true;
                reuse_conn(pcVar10,pcVar20);
                (*Curl_cfree)(pcVar10);
                *local_b8 = pcVar20;
                fix_hostname(data,(connectdata *)&pcVar20->host,host);
                pcVar11 = "host";
                if ((pcVar20->bits).proxy != false) {
                  pcVar11 = "proxy";
                }
                Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",
                           pcVar20->connection_id,pcVar11,
                           *(undefined8 *)
                            (pcVar20->primary_ip +
                            (ulong)((pcVar20->proxy).name != (char *)0x0) * 0x20 + -0x34));
              }
              pcVar20->inuse = true;
              Curl_init_do(data,pcVar20);
              CVar5 = setup_range(data);
              in_connect = local_b8;
              if (CVar5 == CURLE_OK) {
                pcVar20->seek_func = (data->set).seek_func;
                pcVar20->seek_client = (data->set).seek_client;
                CVar5 = resolve_server(data,pcVar20,local_58);
                in_connect = local_b8;
              }
              goto LAB_0011a381;
            }
            break;
          }
          pCVar21 = *ppCVar22;
        } while (pCVar21 != (Curl_handler *)0x0);
        Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",local_a8);
        in_connect = local_b8;
        CVar5 = CURLE_UNSUPPORTED_PROTOCOL;
      }
      goto LAB_0011a381;
    }
  }
LAB_0011a335:
  Curl_llist_destroy(pcVar10->send_pipe,(void *)0x0);
  Curl_llist_destroy(pcVar10->recv_pipe,(void *)0x0);
  pcVar10->send_pipe = (curl_llist *)0x0;
  pcVar10->recv_pipe = (curl_llist *)0x0;
  (*Curl_cfree)(pcVar10->master_buffer);
  (*Curl_cfree)(pcVar10->localdev);
  (*Curl_cfree)(pcVar10);
LAB_0011a381:
  (*Curl_cfree)(local_88);
  (*Curl_cfree)(local_98);
  (*Curl_cfree)(local_90);
  (*Curl_cfree)((void *)0x0);
  if (CVar5 == CURLE_OK) {
    pcVar10 = *in_connect;
    if ((pcVar10->send_pipe->size != 0) || (pcVar10->recv_pipe->size != 0)) {
      *protocol_done = true;
      return CURLE_OK;
    }
    if (*local_58 != false) {
      return CURLE_OK;
    }
    CVar5 = Curl_setup_conn(pcVar10,protocol_done);
  }
  if (CVar5 != CURLE_OK) {
    if (CVar5 == CURLE_NO_CONNECTION_AVAILABLE) {
      *in_connect = (connectdata *)0x0;
      CVar5 = CURLE_NO_CONNECTION_AVAILABLE;
    }
    else if (*in_connect != (connectdata *)0x0) {
      Curl_disconnect(*in_connect,false);
      *in_connect = (connectdata *)0x0;
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_connect(struct SessionHandle *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  result = create_conn(data, in_connect, asyncp);

  if(!result) {
    /* no error */
    if((*in_connect)->send_pipe->size || (*in_connect)->recv_pipe->size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return result;
  }

  if(result && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return result;
}